

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstTestT<short>(void)

{
  int iVar1;
  
  if (ConstTestT<short>()::t == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstTestT<short>()::t);
    if (iVar1 != 0) {
      ConstTestT<short>::t = ConstConstructor<short>();
      __cxa_guard_release(&ConstTestT<short>()::t);
    }
  }
  if (ConstTestT<short>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstTestT<short>()::b);
    if (iVar1 != 0) {
      ConstTestT<short>::b = ConstBool<short>();
      __cxa_guard_release(&ConstTestT<short>()::b);
    }
  }
  return;
}

Assistant:

void ConstTestT()
	{
		static const T t = ConstConstructor<T>();
		static const bool b = ConstBool<T>();
	}